

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Expressions.h
# Opt level: O0

void __thiscall
FunctionCallExpression::GenerateCode(FunctionCallExpression *this,ostream *out,int n)

{
  element_type *peVar1;
  size_type sVar2;
  __shared_ptr_access<Expression,_(__gnu_cxx::_Lock_policy)2,_false,_false> *this_00;
  ulong local_28;
  size_t i;
  int n_local;
  ostream *out_local;
  FunctionCallExpression *this_local;
  
  peVar1 = std::__shared_ptr_access<Expression,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<Expression,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                      &this->m_function);
  (*peVar1->_vptr_Expression[1])(peVar1,out,(ulong)(uint)n);
  std::operator<<(out,'(');
  local_28 = 0;
  while( true ) {
    sVar2 = std::vector<std::shared_ptr<Expression>,_std::allocator<std::shared_ptr<Expression>_>_>
            ::size(&this->m_arguments);
    if (sVar2 <= local_28) break;
    if (local_28 != 0) {
      std::operator<<(out,", ");
    }
    this_00 = (__shared_ptr_access<Expression,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
              std::
              vector<std::shared_ptr<Expression>,_std::allocator<std::shared_ptr<Expression>_>_>::
              operator[](&this->m_arguments,local_28);
    peVar1 = std::__shared_ptr_access<Expression,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->(this_00);
    (*peVar1->_vptr_Expression[1])(peVar1,out,(ulong)(uint)n);
    local_28 = local_28 + 1;
  }
  std::operator<<(out,')');
  return;
}

Assistant:

virtual void GenerateCode( std::ostream& out, int n ) const
	{
		m_function->GenerateCode(out, n);
		out << '(';
		
		for( size_t i = 0; i < m_arguments.size(); ++i)
		{
			if (i > 0)
				out << ", ";

			m_arguments[i]->GenerateCode(out, n);
		}

		out << ')';
	}